

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZEqnArray<std::complex<double>_>,_10>::Resize
          (TPZManVector<TPZEqnArray<std::complex<double>_>,_10> *this,int64_t newsize,
          TPZEqnArray<std::complex<double>_> *object)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  ulong *puVar4;
  TPZEqnArray<std::complex<double>_> *pTVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  TPZEqnArray<std::complex<double>_> *pTVar10;
  long lVar11;
  double dVar12;
  
  if (-1 < newsize) {
    lVar6 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements;
    if (lVar6 != newsize) {
      lVar8 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNAlloc;
      if (lVar8 < newsize) {
        if ((ulong)newsize < 0xb) {
          puVar1 = &this->field_0x20;
          lVar8 = 0;
          for (lVar11 = 0; lVar11 < lVar6; lVar11 = lVar11 + 1) {
            TPZEqnArray<std::complex<double>_>::operator=
                      ((TPZEqnArray<std::complex<double>_> *)(puVar1 + lVar8),
                       (TPZEqnArray<std::complex<double>_> *)
                       ((long)(((this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore)->
                              fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar8 + -0x28));
            lVar6 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements;
            lVar8 = lVar8 + 0x51d0;
          }
          lVar6 = lVar11;
          if (lVar11 < newsize) {
            lVar6 = newsize;
          }
          pTVar10 = (TPZEqnArray<std::complex<double>_> *)(puVar1 + lVar8);
          for (; lVar11 != lVar6; lVar6 = lVar6 + -1) {
            TPZEqnArray<std::complex<double>_>::operator=(pTVar10,object);
            pTVar10 = pTVar10 + 1;
          }
          pTVar10 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore;
          if (pTVar10 != (TPZEqnArray<std::complex<double>_> *)0x0 &&
              pTVar10 != (TPZEqnArray<std::complex<double>_> *)puVar1) {
            lVar6 = *(long *)&pTVar10[-1].fLastTerm;
            if (lVar6 != 0) {
              lVar8 = lVar6 * 0x51d0;
              do {
                TPZEqnArray<std::complex<double>_>::~TPZEqnArray
                          ((TPZEqnArray<std::complex<double>_> *)
                           ((long)pTVar10[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                           lVar8 + -0x28));
                lVar8 = lVar8 + -0x51d0;
              } while (lVar8 != 0);
            }
            operator_delete__(&pTVar10[-1].fLastTerm,lVar6 * 0x51d0 | 8);
          }
          (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore =
               (TPZEqnArray<std::complex<double>_> *)puVar1;
          (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements = newsize;
          (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNAlloc = 10;
        }
        else {
          dVar12 = (double)lVar8 * 1.2;
          uVar9 = (long)dVar12;
          if (dVar12 < (double)newsize) {
            uVar9 = newsize;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar9;
          uVar7 = 0xffffffffffffffff;
          if (SUB168(auVar2 * ZEXT816(0x51d0),8) == 0) {
            uVar7 = SUB168(auVar2 * ZEXT816(0x51d0),0) | 8;
          }
          puVar4 = (ulong *)operator_new__(uVar7);
          *puVar4 = uVar9;
          pTVar10 = (TPZEqnArray<std::complex<double>_> *)(puVar4 + 1);
          if (uVar9 != 0) {
            lVar6 = 0;
            pTVar5 = pTVar10;
            do {
              TPZEqnArray<std::complex<double>_>::TPZEqnArray(pTVar5);
              lVar6 = lVar6 + -0x51d0;
              pTVar5 = pTVar5 + 1;
            } while (uVar9 * -0x51d0 - lVar6 != 0);
          }
          lVar8 = 0;
          for (lVar6 = 0;
              lVar6 < (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements;
              lVar6 = lVar6 + 1) {
            TPZEqnArray<std::complex<double>_>::operator=
                      ((TPZEqnArray<std::complex<double>_> *)
                       ((long)(pTVar10->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar8 + -0x28),
                       (TPZEqnArray<std::complex<double>_> *)
                       ((long)(((this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore)->
                              fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar8 + -0x28));
            lVar8 = lVar8 + 0x51d0;
          }
          lVar11 = lVar6;
          if (lVar6 < newsize) {
            lVar11 = newsize;
          }
          pTVar5 = (TPZEqnArray<std::complex<double>_> *)
                   ((long)(pTVar10->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar8 + -0x28
                   );
          for (; lVar6 != lVar11; lVar11 = lVar11 + -1) {
            TPZEqnArray<std::complex<double>_>::operator=(pTVar5,object);
            pTVar5 = pTVar5 + 1;
          }
          pTVar5 = (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore;
          if (pTVar5 != (TPZEqnArray<std::complex<double>_> *)0x0 &&
              pTVar5 != (TPZEqnArray<std::complex<double>_> *)&this->field_0x20) {
            lVar6 = *(long *)&pTVar5[-1].fLastTerm;
            if (lVar6 != 0) {
              lVar8 = lVar6 * 0x51d0;
              do {
                TPZEqnArray<std::complex<double>_>::~TPZEqnArray
                          ((TPZEqnArray<std::complex<double>_> *)
                           ((long)pTVar5[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                           lVar8 + -0x28));
                lVar8 = lVar8 + -0x51d0;
              } while (lVar8 != 0);
            }
            operator_delete__(&pTVar5[-1].fLastTerm,lVar6 * 0x51d0 | 8);
          }
          (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore = pTVar10;
          (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements = newsize;
          (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNAlloc = uVar9;
        }
      }
      else {
        lVar8 = lVar6 * 0x51d0;
        for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
          TPZEqnArray<std::complex<double>_>::operator=
                    ((TPZEqnArray<std::complex<double>_> *)
                     ((long)(((this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fStore)->
                            fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar8 + -0x28),object
                    );
          lVar8 = lVar8 + 0x51d0;
        }
        (this->super_TPZVec<TPZEqnArray<std::complex<double>_>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}